

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listmenu.cpp
# Opt level: O2

void __thiscall DListMenu::Drawer(DListMenu *this)

{
  uint uVar1;
  uint uVar2;
  FListMenuDescriptor *pFVar3;
  FListMenuItem *pFVar4;
  uint i;
  ulong uVar5;
  
  uVar5 = 0;
  while( true ) {
    pFVar3 = this->mDesc;
    uVar1 = (pFVar3->mItems).super_TArray<FListMenuItem_*,_FListMenuItem_*>.Count;
    if (uVar1 <= uVar5) break;
    pFVar4 = (pFVar3->mItems).super_TArray<FListMenuItem_*,_FListMenuItem_*>.Array[uVar5];
    if (pFVar4->mEnabled == true) {
      (*pFVar4->_vptr_FListMenuItem[4])(pFVar4,(ulong)(uVar5 == (uint)pFVar3->mSelectedItem));
    }
    uVar5 = uVar5 + 1;
  }
  uVar2 = pFVar3->mSelectedItem;
  if (-1 < (int)uVar2 && (int)uVar2 < (int)uVar1) {
    FListMenuItem::DrawSelector
              ((pFVar3->mItems).super_TArray<FListMenuItem_*,_FListMenuItem_*>.Array[uVar2],
               pFVar3->mSelectOfsX,pFVar3->mSelectOfsY,(FTextureID)(pFVar3->mSelector).texnum);
  }
  DMenu::Drawer(&this->super_DMenu);
  return;
}

Assistant:

void DListMenu::Drawer ()
{
	for(unsigned i=0;i<mDesc->mItems.Size(); i++)
	{
		if (mDesc->mItems[i]->mEnabled) mDesc->mItems[i]->Drawer(mDesc->mSelectedItem == (int)i);
	}
	if (mDesc->mSelectedItem >= 0 && mDesc->mSelectedItem < (int)mDesc->mItems.Size())
		mDesc->mItems[mDesc->mSelectedItem]->DrawSelector(mDesc->mSelectOfsX, mDesc->mSelectOfsY, mDesc->mSelector);
	Super::Drawer();
}